

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

bool __thiscall cmMakefile::IsDefinitionSet(cmMakefile *this,string *name)

{
  cmake *pcVar1;
  string *psVar2;
  cmVariableWatch *this_00;
  bool bVar3;
  
  psVar2 = cmStateSnapshot::GetDefinition(&this->StateSnapshot,name);
  bVar3 = true;
  if (psVar2 == (string *)0x0) {
    psVar2 = cmState::GetInitializedCacheValue
                       ((this->GlobalGenerator->CMakeInstance->State)._M_t.
                        super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                        super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                        super__Head_base<0UL,_cmState_*,_false>._M_head_impl,name);
    bVar3 = psVar2 != (string *)0x0;
  }
  pcVar1 = this->GlobalGenerator->CMakeInstance;
  if (pcVar1 == (cmake *)0x0) {
    this_00 = (cmVariableWatch *)0x0;
  }
  else {
    this_00 = (pcVar1->VariableWatch)._M_t.
              super___uniq_ptr_impl<cmVariableWatch,_std::default_delete<cmVariableWatch>_>._M_t.
              super__Tuple_impl<0UL,_cmVariableWatch_*,_std::default_delete<cmVariableWatch>_>.
              super__Head_base<0UL,_cmVariableWatch_*,_false>._M_head_impl;
  }
  if (this_00 != (cmVariableWatch *)0x0 && bVar3 == false) {
    cmVariableWatch::VariableAccessed(this_00,name,2,(char *)0x0,this);
  }
  return bVar3;
}

Assistant:

bool cmMakefile::IsDefinitionSet(const std::string& name) const
{
  const std::string* def = this->StateSnapshot.GetDefinition(name);
  if (!def) {
    def = this->GetState()->GetInitializedCacheValue(name);
  }
#ifdef CMAKE_BUILD_WITH_CMAKE
  if (cmVariableWatch* vv = this->GetVariableWatch()) {
    if (!def) {
      vv->VariableAccessed(
        name, cmVariableWatch::UNKNOWN_VARIABLE_DEFINED_ACCESS, nullptr, this);
    }
  }
#endif
  return def != nullptr;
}